

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ColladaParser.cpp
# Opt level: O0

void __thiscall Assimp::ColladaParser::TestOpening(ColladaParser *this,char *pName)

{
  uint uVar1;
  int iVar2;
  basic_formatter<char,std::char_traits<char>,std::allocator<char>> *pbVar3;
  basic_formatter *pbVar4;
  undefined4 extraout_var;
  basic_formatter<char,std::char_traits<char>,std::allocator<char>> local_4f0 [376];
  string local_378;
  basic_formatter<char,std::char_traits<char>,std::allocator<char>> local_358 [376];
  string local_1e0;
  basic_formatter<char,std::char_traits<char>,std::allocator<char>> local_1b0 [376];
  string local_38;
  char *local_18;
  char *pName_local;
  ColladaParser *this_local;
  
  local_18 = pName;
  pName_local = (char *)this;
  uVar1 = (*this->mReader->_vptr_IIrrXMLReader[2])();
  if ((uVar1 & 1) == 0) {
    Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::basic_formatter
              ((basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1b0);
    pbVar3 = (basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
             Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
             operator<<(local_1b0,(char (*) [44])"Unexpected end of file while beginning of <");
    pbVar3 = (basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
             Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
             operator<<(pbVar3,&local_18);
    pbVar4 = (basic_formatter *)
             Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
             operator<<(pbVar3,(char (*) [11])0xbb7096);
    Formatter::basic_formatter::operator_cast_to_string(&local_38,pbVar4);
    ThrowException(this,&local_38);
  }
  iVar2 = (*this->mReader->_vptr_IIrrXMLReader[3])();
  if ((iVar2 == 3) && (uVar1 = (*this->mReader->_vptr_IIrrXMLReader[2])(), (uVar1 & 1) == 0)) {
    Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::basic_formatter
              ((basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> *)local_358);
    pbVar3 = (basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
             Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
             operator<<(local_358,
                        (char (*) [52])"Unexpected end of file while reading beginning of <");
    pbVar3 = (basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
             Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
             operator<<(pbVar3,&local_18);
    pbVar4 = (basic_formatter *)
             Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
             operator<<(pbVar3,(char (*) [11])0xbb7096);
    Formatter::basic_formatter::operator_cast_to_string(&local_1e0,pbVar4);
    ThrowException(this,&local_1e0);
  }
  iVar2 = (*this->mReader->_vptr_IIrrXMLReader[3])();
  if (iVar2 == 1) {
    iVar2 = (*this->mReader->_vptr_IIrrXMLReader[0xd])();
    iVar2 = strcmp((char *)CONCAT44(extraout_var,iVar2),local_18);
    if (iVar2 == 0) {
      return;
    }
  }
  Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::basic_formatter
            ((basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> *)local_4f0);
  pbVar3 = (basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
           Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::operator<<
                     (local_4f0,(char (*) [20])"Expected start of <");
  pbVar3 = (basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
           Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::operator<<
                     (pbVar3,&local_18);
  pbVar4 = (basic_formatter *)
           Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::operator<<
                     (pbVar3,(char (*) [11])0xbb7096);
  Formatter::basic_formatter::operator_cast_to_string(&local_378,pbVar4);
  ThrowException(this,&local_378);
}

Assistant:

void ColladaParser::TestOpening(const char* pName) {
    // read element start
    if (!mReader->read()) {
        ThrowException(format() << "Unexpected end of file while beginning of <" << pName << "> element.");
    }
    // whitespace in front is ok, just read again if found
    if (mReader->getNodeType() == irr::io::EXN_TEXT) {
        if (!mReader->read()) {
            ThrowException(format() << "Unexpected end of file while reading beginning of <" << pName << "> element.");
        }
    }

    if (mReader->getNodeType() != irr::io::EXN_ELEMENT || strcmp(mReader->getNodeName(), pName) != 0) {
        ThrowException(format() << "Expected start of <" << pName << "> element.");
    }
}